

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O2

MetricInfo __thiscall
xLearn::Trainer::calc_metric
          (Trainer *this,vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *reader_list)

{
  pointer ppRVar1;
  Reader *pRVar2;
  Metric *pMVar3;
  uint uVar4;
  ostream *poVar5;
  int i;
  ulong uVar6;
  MetricInfo MVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  allocator local_7e;
  allocator local_7d;
  Logger local_7c;
  vector<float,_std::allocator<float>_> pred;
  DMatrix *matrix;
  undefined1 local_38 [16];
  
  if ((reader_list->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl
      .super__Vector_impl_data._M_start !=
      (reader_list->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl
      .super__Vector_impl_data._M_finish) {
    pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._0_16_ =
         ZEXT816(0) << 0x40;
    auVar9 = ZEXT1664((undefined1  [16])
                      pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._0_16_);
    matrix = (DMatrix *)0x0;
    pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (this->metric_ != (Metric *)0x0) {
      (*this->metric_->_vptr_Metric[3])();
    }
    (*this->loss_->_vptr_Loss[7])();
    uVar6 = 0;
    while( true ) {
      auVar8 = auVar9._0_16_;
      ppRVar1 = (reader_list->
                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(reader_list->
                        super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= uVar6)
      break;
      (*ppRVar1[uVar6]->_vptr_Reader[5])();
      while( true ) {
        pRVar2 = (reader_list->
                 super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar6];
        uVar4 = (*pRVar2->_vptr_Reader[4])(pRVar2,&matrix);
        if (uVar4 == 0) break;
        if ((long)pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2 != (ulong)uVar4) {
          std::vector<float,_std::allocator<float>_>::resize(&pred,(ulong)uVar4);
        }
        (*this->loss_->_vptr_Loss[3])(this->loss_,matrix,this->model_,&pred);
        (*this->loss_->_vptr_Loss[2])(this->loss_,&pred,&matrix->Y);
        pMVar3 = this->metric_;
        if (pMVar3 != (Metric *)0x0) {
          (*pMVar3->_vptr_Metric[2])(pMVar3,&matrix->Y,&pred);
        }
      }
      uVar6 = uVar6 + 1;
    }
    (*this->loss_->_vptr_Loss[6])();
    local_38 = auVar8;
    if (this->metric_ != (Metric *)0x0) {
      (*this->metric_->_vptr_Metric[4])();
      local_38 = vinsertps_avx(local_38,auVar8,0x10);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&pred.super__Vector_base<float,_std::allocator<float>_>);
    MVar7.loss_val = (real_t)local_38._0_4_;
    MVar7.metric_val = (real_t)local_38._4_4_;
    return MVar7;
  }
  local_7c.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&pred,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/trainer.cc"
             ,&local_7d);
  std::__cxx11::string::string((string *)&matrix,"calc_metric",&local_7e);
  poVar5 = Logger::Start(ERR,(string *)&pred,0x10e,(string *)&matrix);
  poVar5 = std::operator<<(poVar5,"CHECK_NE failed ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/trainer.cc"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x10e);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"reader_list.empty()");
  poVar5 = std::operator<<(poVar5," = ");
  poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"true");
  poVar5 = std::operator<<(poVar5," = ");
  poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&matrix);
  std::__cxx11::string::~string((string *)&pred);
  Logger::~Logger(&local_7c);
  abort();
}

Assistant:

MetricInfo Trainer::calc_metric(std::vector<Reader*>& reader_list) {
  CHECK_NE(reader_list.empty(), true);
  DMatrix* matrix = nullptr;
  std::vector<real_t> pred;
  if (metric_ != nullptr) {
    metric_->Reset();
  }
  loss_->Reset();
  for (int i = 0; i < reader_list.size(); ++i) {
    reader_list[i]->Reset();
    for (;;) {
      index_t tmp = reader_list[i]->Samples(matrix);
      if (tmp == 0) { break; }
      if (tmp != pred.size()) { pred.resize(tmp); }
      loss_->Predict(matrix, *model_, pred);
      loss_->Evalute(pred, matrix->Y);
      if (metric_ != nullptr) {
        metric_->Accumulate(matrix->Y, pred);
      }
    }
  }
  MetricInfo info;
  info.loss_val = loss_->GetLoss();
  if (metric_ != nullptr) {
    info.metric_val = metric_->GetMetric();
  }
  return info;
}